

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stat.h
# Opt level: O0

ostream * operator<<(ostream *out,Stat<int> *stat)

{
  _Setfill<char> _Var1;
  _Setprecision _Var2;
  _Setw _Var3;
  int iVar4;
  ostream *poVar5;
  size_t sVar6;
  float fVar7;
  int defWidth;
  int defPrecision;
  Stat<int> *stat_local;
  ostream *out_local;
  
  poVar5 = (ostream *)std::ostream::operator<<(out,std::fixed);
  _Var2 = std::setprecision(4);
  poVar5 = std::operator<<(poVar5,_Var2);
  _Var1 = std::setfill<char>(' ');
  poVar5 = std::operator<<(poVar5,_Var1._M_c);
  _Var3 = std::setw(7);
  std::operator<<(poVar5,_Var3);
  poVar5 = std::operator<<(out,"range: [");
  _Var3 = std::setw(7);
  poVar5 = std::operator<<(poVar5,_Var3);
  iVar4 = Stat<int>::GetMin(stat);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
  poVar5 = std::operator<<(poVar5," ");
  iVar4 = Stat<int>::GetMax(stat);
  std::ostream::operator<<(poVar5,iVar4);
  poVar5 = std::operator<<(out,"], mean: ");
  fVar7 = Stat<int>::GetMean(stat);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,fVar7);
  poVar5 = std::operator<<(poVar5,", cnt: ");
  sVar6 = Stat<int>::GetCnt(stat);
  std::ostream::operator<<(poVar5,sVar6);
  poVar5 = std::operator<<(out,", sumOfSquares: ");
  fVar7 = Stat<int>::GetMeanSquare(stat);
  std::ostream::operator<<(poVar5,fVar7);
  poVar5 = std::operator<<(out,", ref: ");
  iVar4 = Stat<int>::GetRef(stat);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
  return poVar5;
}

Assistant:

std::ostream &operator<<( std::ostream &out, const Stat<M> &stat )
{
    int defPrecision = 4;
    int defWidth = defPrecision + 3;
    out << std::fixed << std::setprecision( defPrecision ) << std::setfill( ' ' ) << std::setw( defWidth );
    out << "range: [" << std::setw( defWidth ) << stat.GetMin() << " " << stat.GetMax();
    out << "], mean: " << stat.GetMean() << ", cnt: " << stat.GetCnt();
    out << ", sumOfSquares: " << stat.GetMeanSquare();
    return out << ", ref: " << stat.GetRef();
}